

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_ref_t art_move_node_to_shrink(art_t *art,art_ref_t ref)

{
  art_t *index;
  byte typecode_00;
  art_t *next_free_00;
  art_t *art_00;
  art_node_t *paVar1;
  art_t *paVar2;
  art_ref_t in_RSI;
  uint64_t in_RDI;
  uint64_t current;
  uint64_t initial_next_free;
  uint64_t next_free;
  uint64_t to;
  uint64_t from;
  uint64_t first_free;
  art_typecode_t typecode;
  uint64_t idx;
  art_t *local_78;
  uint64_t in_stack_ffffffffffffff90;
  art_typecode_t typecode_01;
  uint64_t index_00;
  art_t *in_stack_ffffffffffffffa0;
  art_t *in_stack_ffffffffffffffa8;
  art_t *paVar3;
  art_t *local_48;
  art_ref_t local_8;
  
  next_free_00 = (art_t *)art_ref_index(in_RSI);
  typecode_00 = art_ref_typecode(in_RSI);
  index = *(art_t **)(in_RDI + 8 + (ulong)typecode_00 * 8);
  local_8 = in_RSI;
  if (index <= next_free_00) {
    index_00 = in_RDI;
    art_to_ref((uint64_t)index,typecode_00);
    local_78 = (art_t *)art_node_get_next_free
                                  (in_stack_ffffffffffffffa8,(art_ref_t)in_stack_ffffffffffffffa0);
    typecode_01 = (art_typecode_t)(in_stack_ffffffffffffff90 >> 0x38);
    art_00 = (art_t *)art_get_node(in_stack_ffffffffffffffa0,index_00,typecode_01);
    paVar1 = art_get_node(art_00,index_00,typecode_01);
    memcpy(art_00,paVar1,ART_NODE_SIZES[typecode_00]);
    paVar3 = local_78;
    local_48 = local_78;
    while (local_48 < next_free_00) {
      art_to_ref((uint64_t)local_48,typecode_00);
      paVar2 = (art_t *)art_node_get_next_free(local_48,(art_ref_t)art_00);
      in_stack_ffffffffffffff90 = in_RDI;
      paVar3 = local_48;
      local_48 = paVar2;
    }
    paVar1 = art_deref(art_00,index_00);
    art_node_set_next_free(paVar1,typecode_00,(uint64_t)local_48);
    if (paVar3 < next_free_00) {
      paVar1 = art_get_node(art_00,index_00,(art_typecode_t)(in_stack_ffffffffffffff90 >> 0x38));
      art_node_set_next_free(paVar1,typecode_00,(uint64_t)next_free_00);
    }
    if (next_free_00 < local_78) {
      local_78 = next_free_00;
    }
    *(art_t **)(in_RDI + 8 + (ulong)typecode_00 * 8) = local_78;
    local_8 = art_to_ref((uint64_t)index,typecode_00);
  }
  return local_8;
}

Assistant:

static art_ref_t art_move_node_to_shrink(art_t *art, art_ref_t ref) {
    uint64_t idx = art_ref_index(ref);
    art_typecode_t typecode = art_ref_typecode(ref);
    uint64_t first_free = art->first_free[typecode];
    assert(idx != first_free);
    if (idx < first_free) {
        return ref;
    }
    uint64_t from = idx;
    uint64_t to = first_free;
    uint64_t next_free = art_node_get_next_free(art, art_to_ref(to, typecode));
    memcpy(art_get_node(art, to, typecode), art_get_node(art, from, typecode),
           ART_NODE_SIZES[typecode]);

    // With an integer representing the next free index, and an `x` representing
    // an occupied index, assume the following scenario at the start of this
    // function:
    //     nodes = [1,2,5,x,x]
    //     first_free = 0
    //
    // We just moved a node from index 3 to 0:
    //     nodes = [x,2,5,?,x]
    //
    // We need to modify the free list so that the free indices are ascending.
    // This can be done by traversing the list until we find a node with a
    // `next_free` greater than the index we copied the node from, and inserting
    // the new index in between. This leads to the following:
    //     nodes = [x,2,3,5,x]
    //     first_free = 1
    uint64_t initial_next_free = next_free;
    uint64_t current = next_free;
    while (next_free < from) {
        current = next_free;
        next_free =
            art_node_get_next_free(art, art_to_ref(next_free, typecode));
    }
    art_node_set_next_free(art_deref(art, ref), typecode, next_free);
    if (current < from) {
        art_node_set_next_free(art_get_node(art, current, typecode), typecode,
                               from);
    }
    art->first_free[typecode] =
        from < initial_next_free ? from : initial_next_free;
    return art_to_ref(to, typecode);
}